

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

int XMLSearch_search_remove_attribute(XMLSearch *search,int i_attr)

{
  int iVar1;
  SXML_CHAR *pSVar2;
  XMLAttribute *__src;
  ulong uVar3;
  XMLAttribute *__dest;
  int iVar4;
  
  iVar4 = -1;
  if (-1 < i_attr && search != (XMLSearch *)0x0) {
    uVar3 = (ulong)(uint)i_attr;
    iVar1 = search->n_attributes;
    if (i_attr < iVar1) {
      if (iVar1 == 1) {
        __dest = (XMLAttribute *)0x0;
      }
      else {
        __dest = (XMLAttribute *)malloc((ulong)(iVar1 - 1) * 0x18);
        if (__dest == (XMLAttribute *)0x0) {
          return -1;
        }
      }
      pSVar2 = search->attributes[uVar3].name;
      if (pSVar2 != (SXML_CHAR *)0x0) {
        free(pSVar2);
      }
      pSVar2 = search->attributes[uVar3].value;
      if (pSVar2 != (SXML_CHAR *)0x0) {
        free(pSVar2);
      }
      if (__dest != (XMLAttribute *)0x0) {
        __src = search->attributes;
        memcpy(__dest,__src,uVar3 * 0x18);
        memcpy(__dest + uVar3,__src + uVar3 + 1,(long)(~i_attr + search->n_attributes) * 0x18);
      }
      if (search->attributes != (XMLAttribute *)0x0) {
        free(search->attributes);
      }
      search->attributes = __dest;
      iVar4 = search->n_attributes + -1;
      search->n_attributes = iVar4;
    }
  }
  return iVar4;
}

Assistant:

int XMLSearch_search_remove_attribute(XMLSearch* search, int i_attr)
{
	XMLAttribute* pt;

	if (search == NULL || i_attr < 0 || i_attr >= search->n_attributes)
		return -1;

	/* Free attribute fields first */
	if (search->n_attributes == 1)
		pt = NULL;
	else {
		pt = (XMLAttribute*)__malloc((search->n_attributes - 1) * sizeof(XMLAttribute));
		if (pt == NULL)
			return -1;
	}
	if (search->attributes[i_attr].name != NULL)
		__free(search->attributes[i_attr].name);
	if (search->attributes[i_attr].value != NULL)
		__free(search->attributes[i_attr].value);

	if (pt != NULL) {
		memcpy(pt, search->attributes, i_attr * sizeof(XMLAttribute));
		memcpy(&pt[i_attr], &search->attributes[i_attr + 1], (search->n_attributes - i_attr - 1) * sizeof(XMLAttribute));
	}
	if (search->attributes)
		__free(search->attributes);
	search->attributes = pt;
	search->n_attributes--;

	return search->n_attributes;
}